

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage5_avx2(__m256i *x4,__m256i *x5,__m256i *cospi_m32,__m256i *cospi_p32,
                       __m256i *cospi_m16,__m256i *cospi_p48,__m256i *cospi_m48,__m256i *__rounding,
                       int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  auVar1 = vpaddd_avx2(*in_RDI,in_RDI[3]);
  *in_RSI = auVar1;
  auVar1 = vpsubd_avx2(*in_RDI,in_RDI[3]);
  in_RSI[3] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[1],in_RDI[2]);
  in_RSI[1] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[1],in_RDI[2]);
  in_RSI[2] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[4] + 8);
  uVar4 = *(undefined8 *)(in_RDI[4] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[4] + 0x18);
  *(undefined8 *)in_RSI[4] = *(undefined8 *)in_RDI[4];
  *(undefined8 *)(in_RSI[4] + 8) = uVar3;
  *(undefined8 *)(in_RSI[4] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[4] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[5],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[6],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[5] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[5],(undefined1  [32])*cospi_m48);
  in_RSI[5] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[5],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[5] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[5],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[6],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[6] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[6],(undefined1  [32])*cospi_m48);
  in_RSI[6] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[6],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[6] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[7] + 8);
  uVar4 = *(undefined8 *)(in_RDI[7] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[7] + 0x18);
  *(undefined8 *)in_RSI[7] = *(undefined8 *)in_RDI[7];
  *(undefined8 *)(in_RSI[7] + 8) = uVar3;
  *(undefined8 *)(in_RSI[7] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[7] + 0x18) = uVar5;
  auVar1 = vpaddd_avx2(in_RDI[8],in_RDI[0xb]);
  in_RSI[8] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[8],in_RDI[0xb]);
  in_RSI[0xb] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[9],in_RDI[10]);
  in_RSI[9] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[9],in_RDI[10]);
  in_RSI[10] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xf],in_RDI[0xc]);
  in_RSI[0xc] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xf],in_RDI[0xc]);
  in_RSI[0xf] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xe],in_RDI[0xd]);
  in_RSI[0xd] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xe],in_RDI[0xd]);
  in_RSI[0xe] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x10] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x10] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x10] + 0x18);
  *(undefined8 *)in_RSI[0x10] = *(undefined8 *)in_RDI[0x10];
  *(undefined8 *)(in_RSI[0x10] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x10] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x10] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x11] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x11] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x11] + 0x18);
  *(undefined8 *)in_RSI[0x11] = *(undefined8 *)in_RDI[0x11];
  *(undefined8 *)(in_RSI[0x11] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x11] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x11] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x12],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x1d],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x12] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x12],(undefined1  [32])*cospi_m48);
  in_RSI[0x12] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x12],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x12] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x12],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x1d],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1d] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1d],(undefined1  [32])*cospi_m48);
  in_RSI[0x1d] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1d],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x1d] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x13],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x1c],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x13] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x13],(undefined1  [32])*cospi_m48);
  in_RSI[0x13] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x13],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x13] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x13],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x1c],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1c] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1c],(undefined1  [32])*cospi_m48);
  in_RSI[0x1c] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1c],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x1c] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x14],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x1b],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x14] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x14],(undefined1  [32])*cospi_m48);
  in_RSI[0x14] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x14],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x14] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x14],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x1b],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1b],(undefined1  [32])*cospi_m48);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1b],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x1b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x15],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x1a],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x15] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x15],(undefined1  [32])*cospi_m48);
  in_RSI[0x15] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x15],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x15] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x15],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x1a],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x1a],(undefined1  [32])*cospi_m48);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x1a],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x1a] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x16] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x16] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x16] + 0x18);
  *(undefined8 *)in_RSI[0x16] = *(undefined8 *)in_RDI[0x16];
  *(undefined8 *)(in_RSI[0x16] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x16] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x16] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x17] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x17] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x17] + 0x18);
  *(undefined8 *)in_RSI[0x17] = *(undefined8 *)in_RDI[0x17];
  *(undefined8 *)(in_RSI[0x17] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x17] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x17] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x18] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x18] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x18] + 0x18);
  *(undefined8 *)in_RSI[0x18] = *(undefined8 *)in_RDI[0x18];
  *(undefined8 *)(in_RSI[0x18] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x18] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x18] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x19] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x19] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x19] + 0x18);
  *(undefined8 *)in_RSI[0x19] = *(undefined8 *)in_RDI[0x19];
  *(undefined8 *)(in_RSI[0x19] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x19] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x19] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x1e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1e] + 0x18);
  *(undefined8 *)in_RSI[0x1e] = *(undefined8 *)in_RDI[0x1e];
  *(undefined8 *)(in_RSI[0x1e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x1f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x1f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x1f] + 0x18);
  *(undefined8 *)in_RSI[0x1f] = *(undefined8 *)in_RDI[0x1f];
  *(undefined8 *)(in_RSI[0x1f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x1f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x1f] + 0x18) = uVar5;
  auVar1 = vpaddd_avx2(in_RDI[0x20],in_RDI[0x27]);
  in_RSI[0x20] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x20],in_RDI[0x27]);
  in_RSI[0x27] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x21],in_RDI[0x26]);
  in_RSI[0x21] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x21],in_RDI[0x26]);
  in_RSI[0x26] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x22],in_RDI[0x25]);
  in_RSI[0x22] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x22],in_RDI[0x25]);
  in_RSI[0x25] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x23],in_RDI[0x24]);
  in_RSI[0x23] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x23],in_RDI[0x24]);
  in_RSI[0x24] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x2f],in_RDI[0x28]);
  in_RSI[0x28] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x2f],in_RDI[0x28]);
  in_RSI[0x2f] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x2e],in_RDI[0x29]);
  in_RSI[0x29] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x2e],in_RDI[0x29]);
  in_RSI[0x2e] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x2d],in_RDI[0x2a]);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x2d],in_RDI[0x2a]);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x2c],in_RDI[0x2b]);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x2c],in_RDI[0x2b]);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x30],in_RDI[0x37]);
  in_RSI[0x30] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x30],in_RDI[0x37]);
  in_RSI[0x37] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x31],in_RDI[0x36]);
  in_RSI[0x31] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x31],in_RDI[0x36]);
  in_RSI[0x36] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x32],in_RDI[0x35]);
  in_RSI[0x32] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x32],in_RDI[0x35]);
  in_RSI[0x35] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x33],in_RDI[0x34]);
  in_RSI[0x33] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x33],in_RDI[0x34]);
  in_RSI[0x34] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3f],in_RDI[0x38]);
  in_RSI[0x38] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3f],in_RDI[0x38]);
  in_RSI[0x3f] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3e],in_RDI[0x39]);
  in_RSI[0x39] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3e],in_RDI[0x39]);
  in_RSI[0x3e] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3d],in_RDI[0x3a]);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3d],in_RDI[0x3a]);
  in_RSI[0x3d] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x3c],in_RDI[0x3b]);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x3c],in_RDI[0x3b]);
  in_RSI[0x3c] = auVar1;
  return;
}

Assistant:

static inline void fdct64_stage5_avx2(__m256i *x4, __m256i *x5,
                                      __m256i *cospi_m32, __m256i *cospi_p32,
                                      __m256i *cospi_m16, __m256i *cospi_p48,
                                      __m256i *cospi_m48,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  x5[0] = _mm256_add_epi32(x4[0], x4[3]);
  x5[3] = _mm256_sub_epi32(x4[0], x4[3]);
  x5[1] = _mm256_add_epi32(x4[1], x4[2]);
  x5[2] = _mm256_sub_epi32(x4[1], x4[2]);
  x5[4] = x4[4];
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x4[5], x4[6], x5[5], x5[6],
                        *__rounding, cos_bit);
  x5[7] = x4[7];
  x5[8] = _mm256_add_epi32(x4[8], x4[11]);
  x5[11] = _mm256_sub_epi32(x4[8], x4[11]);
  x5[9] = _mm256_add_epi32(x4[9], x4[10]);
  x5[10] = _mm256_sub_epi32(x4[9], x4[10]);
  x5[12] = _mm256_sub_epi32(x4[15], x4[12]);
  x5[15] = _mm256_add_epi32(x4[15], x4[12]);
  x5[13] = _mm256_sub_epi32(x4[14], x4[13]);
  x5[14] = _mm256_add_epi32(x4[14], x4[13]);
  x5[16] = x4[16];
  x5[17] = x4[17];
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x4[18], x4[29], x5[18], x5[29],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x4[19], x4[28], x5[19], x5[28],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x4[20], x4[27], x5[20], x5[27],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x4[21], x4[26], x5[21], x5[26],
                        *__rounding, cos_bit);
  x5[22] = x4[22];
  x5[23] = x4[23];
  x5[24] = x4[24];
  x5[25] = x4[25];
  x5[30] = x4[30];
  x5[31] = x4[31];
  x5[32] = _mm256_add_epi32(x4[32], x4[39]);
  x5[39] = _mm256_sub_epi32(x4[32], x4[39]);
  x5[33] = _mm256_add_epi32(x4[33], x4[38]);
  x5[38] = _mm256_sub_epi32(x4[33], x4[38]);
  x5[34] = _mm256_add_epi32(x4[34], x4[37]);
  x5[37] = _mm256_sub_epi32(x4[34], x4[37]);
  x5[35] = _mm256_add_epi32(x4[35], x4[36]);
  x5[36] = _mm256_sub_epi32(x4[35], x4[36]);
  x5[40] = _mm256_sub_epi32(x4[47], x4[40]);
  x5[47] = _mm256_add_epi32(x4[47], x4[40]);
  x5[41] = _mm256_sub_epi32(x4[46], x4[41]);
  x5[46] = _mm256_add_epi32(x4[46], x4[41]);
  x5[42] = _mm256_sub_epi32(x4[45], x4[42]);
  x5[45] = _mm256_add_epi32(x4[45], x4[42]);
  x5[43] = _mm256_sub_epi32(x4[44], x4[43]);
  x5[44] = _mm256_add_epi32(x4[44], x4[43]);
  x5[48] = _mm256_add_epi32(x4[48], x4[55]);
  x5[55] = _mm256_sub_epi32(x4[48], x4[55]);
  x5[49] = _mm256_add_epi32(x4[49], x4[54]);
  x5[54] = _mm256_sub_epi32(x4[49], x4[54]);
  x5[50] = _mm256_add_epi32(x4[50], x4[53]);
  x5[53] = _mm256_sub_epi32(x4[50], x4[53]);
  x5[51] = _mm256_add_epi32(x4[51], x4[52]);
  x5[52] = _mm256_sub_epi32(x4[51], x4[52]);
  x5[56] = _mm256_sub_epi32(x4[63], x4[56]);
  x5[63] = _mm256_add_epi32(x4[63], x4[56]);
  x5[57] = _mm256_sub_epi32(x4[62], x4[57]);
  x5[62] = _mm256_add_epi32(x4[62], x4[57]);
  x5[58] = _mm256_sub_epi32(x4[61], x4[58]);
  x5[61] = _mm256_add_epi32(x4[61], x4[58]);
  x5[59] = _mm256_sub_epi32(x4[60], x4[59]);
  x5[60] = _mm256_add_epi32(x4[60], x4[59]);
}